

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O2

JDIMENSION get_16bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  byte bVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  UINT8 *pUVar4;
  bool bVar5;
  
  JVar3 = cinfo->image_width;
  pUVar4 = *sinfo->buffer + 2;
  while (bVar5 = JVar3 != 0, JVar3 = JVar3 - 1, bVar5) {
    (*(code *)sinfo[1].buffer)(sinfo);
    bVar1 = *(byte *)((long)&sinfo[1].buffer_height + 1);
    JVar2 = sinfo[1].buffer_height;
    *pUVar4 = ""[(byte)sinfo[1].buffer_height & 0x1f];
    pUVar4[-1] = ""[(ushort)((ushort)JVar2 >> 5) & 0x1f];
    pUVar4[-2] = ""[bVar1 >> 2 & 0x1f];
    pUVar4 = pUVar4 + 3;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_16bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 16-bit pixels */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register int t;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    t = UCH(source->tga_pixel[0]);
    t += UCH(source->tga_pixel[1]) << 8;
    /* We expand 5 bit data to 8 bit sample width.
     * The format of the 16-bit (LSB first) input word is
     *     xRRRRRGGGGGBBBBB
     */
    ptr[2] = (JSAMPLE)c5to8bits[t & 0x1F];
    t >>= 5;
    ptr[1] = (JSAMPLE)c5to8bits[t & 0x1F];
    t >>= 5;
    ptr[0] = (JSAMPLE)c5to8bits[t & 0x1F];
    ptr += 3;
  }
  return 1;
}